

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O0

Status __thiscall
google::protobuf::json_internal::JsonLexer::
VisitArray<google::protobuf::json_internal::JsonLexer::SkipValue()::__1>
          (JsonLexer *this,anon_class_8_1_8991fb9c f)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  string_view local_a8;
  string_view local_98;
  byte local_83;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  byte local_69;
  undefined1 auStack_68 [7];
  bool has_comma;
  byte local_51;
  uint local_50;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  byte local_21;
  JsonLexer *local_20;
  JsonLexer *this_local;
  anon_class_8_1_8991fb9c f_local;
  Status *_status;
  
  local_21 = 0;
  local_20 = f.this;
  f_local.this = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,"[");
  JsonLocation::SourceLocation::current();
  Expect(this,f.this,local_38._M_len,local_38._M_str);
  bVar1 = absl::lts_20240722::Status::ok((Status *)this);
  bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
  if (bVar1) {
    local_21 = 1;
  }
  local_50 = (uint)bVar1;
  if ((local_21 & 1) == 0) {
    absl::lts_20240722::Status::~Status((Status *)this);
  }
  if (local_50 == 0) {
    local_51 = 0;
    Push(this);
    bVar1 = absl::lts_20240722::Status::ok((Status *)this);
    bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
    if (bVar1) {
      local_51 = 1;
    }
    local_50 = (uint)bVar1;
    if ((local_51 & 1) == 0) {
      absl::lts_20240722::Status::~Status((Status *)this);
    }
    if (local_50 == 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)auStack_68,"]");
      bVar1 = Peek(f.this,_auStack_68);
      if (bVar1) {
        Pop(f.this);
        absl::lts_20240722::OkStatus();
      }
      else {
        local_69 = 1;
        do {
          if ((local_69 & 1) == 0) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_80,"expected \',\'");
            JsonLocation::SourceLocation::current();
            Invalid(this,f.this,local_80._M_len,local_80._M_str);
            return (Status)(uintptr_t)this;
          }
          local_83 = 0;
          SkipValue::anon_class_8_1_8991fb9c::operator()((anon_class_8_1_8991fb9c *)this);
          bVar1 = absl::lts_20240722::Status::ok((Status *)this);
          bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
          if (bVar1) {
            local_83 = 1;
          }
          local_50 = (uint)bVar1;
          if ((local_83 & 1) == 0) {
            absl::lts_20240722::Status::~Status((Status *)this);
          }
          if (local_50 != 0) {
            return (Status)(uintptr_t)this;
          }
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_98,",");
          local_69 = Peek(f.this,local_98);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"]");
          bVar1 = Peek(f.this,local_a8);
        } while (((bVar1 ^ 0xffU) & 1) != 0);
        if (((((f.this)->options_).allow_legacy_syntax & 1U) == 0) && ((local_69 & 1) != 0)) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_b8,"expected \']\'");
          JsonLocation::SourceLocation::current();
          Invalid(this,f.this,local_b8._M_len,local_b8._M_str);
        }
        else {
          Pop(f.this);
          absl::lts_20240722::OkStatus();
        }
      }
    }
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status JsonLexer::VisitArray(F f) {
  RETURN_IF_ERROR(Expect("["));
  RETURN_IF_ERROR(Push());

  if (Peek("]")) {
    Pop();
    return absl::OkStatus();
  }

  bool has_comma = true;
  do {
    if (!has_comma) {
      return Invalid("expected ','");
    }
    RETURN_IF_ERROR(f());
    has_comma = Peek(",");
  } while (!Peek("]"));

  if (!options_.allow_legacy_syntax && has_comma) {
    return Invalid("expected ']'");
  }

  Pop();
  return absl::OkStatus();
}